

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t write_int(MIR_context_t ctx,writer_func_t writer,int64_t i)

{
  size_t sVar1;
  size_t len;
  size_t nb;
  int64_t i_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  
  if (writer == (writer_func_t)0x0) {
    ctx_local = (MIR_context_t)0x0;
  }
  else {
    sVar1 = int_length(i);
    if (sVar1 == 0) {
      __assert_fail("nb > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x127c,"size_t write_int(MIR_context_t, writer_func_t, int64_t)");
    }
    put_byte(ctx,writer,(int)sVar1 + 8);
    sVar1 = put_int(ctx,writer,i,(int)sVar1);
    ctx_local = (MIR_context_t)(sVar1 + 1);
    ctx->io_ctx->output_int_len = (long)&ctx_local->gen_ctx + ctx->io_ctx->output_int_len;
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t write_int (MIR_context_t ctx, writer_func_t writer, int64_t i) {
  size_t nb, len;

  if (writer == NULL) return 0;
  nb = int_length (i);
  assert (nb > 0);
  put_byte (ctx, writer, TAG_I1 + (int) nb - 1);
  len = put_int (ctx, writer, i, (int) nb) + 1;
  output_int_len += len;
  return len;
}